

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

void prvTidyPushInline(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  uint uVar4;
  IStack *pIVar5;
  tmbstr ptVar6;
  AttVal *pAVar7;
  ulong uVar8;
  Dict *pDVar9;
  
  if (node->implicit != no) {
    return;
  }
  pLVar2 = doc->lexer;
  BVar3 = IsNodePushable(node);
  if (BVar3 != no) {
    pDVar9 = node->tag;
    if (((pDVar9 == (Dict *)0x0) || (pDVar9->id != TidyTag_FONT)) &&
       (BVar3 = prvTidyIsPushed(doc,node), BVar3 != no)) {
      return;
    }
    uVar1 = pLVar2->istacklength;
    uVar4 = pLVar2->istacksize;
    if (uVar1 < uVar4 + 1) {
      uVar8 = 0xc;
      if (uVar1 != 0) {
        uVar8 = (ulong)(uVar1 * 2);
      }
      pLVar2->istacklength = (uint)uVar8;
      pIVar5 = (IStack *)(*doc->allocator->vtbl->realloc)(doc->allocator,pLVar2->istack,uVar8 << 5);
      pLVar2->istack = pIVar5;
      uVar4 = pLVar2->istacksize;
      pDVar9 = node->tag;
    }
    else {
      pIVar5 = pLVar2->istack;
    }
    pIVar5[uVar4].tag = pDVar9;
    ptVar6 = prvTidytmbstrdup(doc->allocator,node->element);
    pIVar5[uVar4].element = ptVar6;
    pAVar7 = prvTidyDupAttrs(doc,node->attributes);
    pIVar5[uVar4].attributes = pAVar7;
    pLVar2->istacksize = pLVar2->istacksize + 1;
  }
  return;
}

Assistant:

void TY_(PushInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;

    if (node->implicit)
        return;

    if ( !IsNodePushable(node) )
        return;

    if ( !nodeIsFONT(node) && TY_(IsPushed)(doc, node) )
        return;

    /* make sure there is enough space for the stack */
    if (lexer->istacksize + 1 > lexer->istacklength)
    {
        if (lexer->istacklength == 0)
            lexer->istacklength = 6;   /* this is perhaps excessive */

        lexer->istacklength = lexer->istacklength * 2;
        lexer->istack = (IStack *)TidyDocRealloc(doc, lexer->istack,
                            sizeof(IStack)*(lexer->istacklength));
    }

    istack = &(lexer->istack[lexer->istacksize]);
    istack->tag = node->tag;

    istack->element = TY_(tmbstrdup)(doc->allocator, node->element);
    istack->attributes = TY_(DupAttrs)( doc, node->attributes );
    ++(lexer->istacksize);
}